

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

string * __thiscall
QPDFObjectHandle::getInlineImageValue_abi_cxx11_
          (string *__return_storage_ptr__,QPDFObjectHandle *this)

{
  bool bVar1;
  element_type *this_00;
  allocator<char> local_4d [20];
  allocator<char> local_39;
  string local_38;
  QPDFObjectHandle *local_18;
  QPDFObjectHandle *this_local;
  
  local_18 = this;
  this_local = (QPDFObjectHandle *)__return_storage_ptr__;
  bVar1 = isInlineImage(this);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    QPDFObject::getStringValue_abi_cxx11_(__return_storage_ptr__,this_00);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"returning empty data",&local_39);
    typeWarning(this,"inlineimage",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    QTC::TC("qpdf","QPDFObjectHandle inlineimage returning empty data",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_4d)
    ;
    std::allocator<char>::~allocator(local_4d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFObjectHandle::getInlineImageValue() const
{
    if (isInlineImage()) {
        return obj->getStringValue();
    } else {
        typeWarning("inlineimage", "returning empty data");
        QTC::TC("qpdf", "QPDFObjectHandle inlineimage returning empty data");
        return "";
    }
}